

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

char * zt_cstr_chomp(char *str)

{
  size_t sVar1;
  char *in_RDI;
  size_t i;
  
  sVar1 = strlen(in_RDI);
  if (in_RDI[sVar1 - 1] == '\n') {
    in_RDI[sVar1 - 1] = '\0';
  }
  return in_RDI;
}

Assistant:

char*
zt_cstr_chomp(char *str) {
    zt_assert(str);
    {
        size_t    i = 0;

        i = strlen(str);
        if (str[i - 1] == '\n') {
            str[i - 1] = '\0';
        }
    }
    return str;
}